

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
TransformPromiseNode<kj::Promise<void>,_kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:2505:30),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:2524:6)>
::getImpl(TransformPromiseNode<kj::Promise<void>,_kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:2505:30),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:2524:6)>
          *this,ExceptionOrValue *output)

{
  Exception *in;
  ExceptionOr<kj::Promise<void>_> *pEVar1;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *in_00;
  Promise<void> local_4d8;
  ExceptionOr<kj::Promise<void>_> local_4c8;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *local_350;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *depValue;
  ExceptionOr<kj::Promise<void>_> local_338;
  Exception *local_1c0;
  Exception *depException;
  undefined1 local_1a8 [8];
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> depResult;
  ExceptionOrValue *output_local;
  TransformPromiseNode<kj::Promise<void>,_kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:2505:30),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:2524:6)>
  *this_local;
  
  depResult.value.ptr.field_1._32_8_ = output;
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::ExceptionOr
            ((ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
             local_1a8);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_1a8);
  local_1c0 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1a8);
  if (local_1c0 == (Exception *)0x0) {
    local_350 = readMaybe<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>
                          ((Maybe<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>
                            *)((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1 + 0x150
                              ));
    if (local_350 != (OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *)0x0) {
      in_00 = mv<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>(local_350);
      MaybeVoidCaller<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>,kj::Promise<void>>
      ::apply<kj::pumpWebSocketLoop(kj::WebSocket&,kj::WebSocket&)::__0>
                ((MaybeVoidCaller<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>,kj::Promise<void>>
                  *)&local_4d8,&this->func,in_00);
      handle(&local_4c8,this,&local_4d8);
      pEVar1 = ExceptionOrValue::as<kj::Promise<void>>
                         ((ExceptionOrValue *)depResult.value.ptr.field_1._32_8_);
      ExceptionOr<kj::Promise<void>_>::operator=(pEVar1,&local_4c8);
      ExceptionOr<kj::Promise<void>_>::~ExceptionOr(&local_4c8);
      Promise<void>::~Promise(&local_4d8);
    }
  }
  else {
    in = mv<kj::Exception>(local_1c0);
    MaybeVoidCaller<kj::Exception,kj::Promise<void>>::
    apply<kj::pumpWebSocketLoop(kj::WebSocket&,kj::WebSocket&)::__1>
              ((MaybeVoidCaller<kj::Exception,kj::Promise<void>> *)&depValue,&this->errorHandler,in)
    ;
    handle(&local_338,this,(Promise<void> *)&depValue);
    pEVar1 = ExceptionOrValue::as<kj::Promise<void>>
                       ((ExceptionOrValue *)depResult.value.ptr.field_1._32_8_);
    ExceptionOr<kj::Promise<void>_>::operator=(pEVar1,&local_338);
    ExceptionOr<kj::Promise<void>_>::~ExceptionOr(&local_338);
    Promise<void>::~Promise((Promise<void> *)&depValue);
  }
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::~ExceptionOr
            ((ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
             local_1a8);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }